

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcCover.c
# Opt level: O3

Mvc_Cover_t * Mvc_CoverAlloc(Mvc_Manager_t *pMem,int nBits)

{
  Mvc_Cover_t *pMVar1;
  int iVar2;
  
  pMVar1 = (Mvc_Cover_t *)Extra_MmFixedEntryFetch(pMem->pManC);
  pMVar1->pMem = pMem;
  pMVar1->nBits = nBits;
  iVar2 = nBits + 0x1f;
  if (-1 < nBits) {
    iVar2 = nBits;
  }
  iVar2 = (uint)(0 < (int)(nBits & 0x8000001fU)) + (iVar2 >> 5);
  pMVar1->nWords = iVar2;
  pMVar1->nUnused = iVar2 * 0x20 - nBits;
  pMVar1->nCubesAlloc = 0;
  pMVar1->pCubes = (Mvc_Cube_t **)0x0;
  (pMVar1->lCubes).pHead = (Mvc_Cube_t *)0x0;
  (pMVar1->lCubes).pTail = (Mvc_Cube_t *)0x0;
  (pMVar1->lCubes).nItems = 0;
  pMVar1->pLits = (int *)0x0;
  pMVar1->pMask = (Mvc_Cube_t *)0x0;
  return pMVar1;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Mvc_Cover_t * Mvc_CoverAlloc( Mvc_Manager_t * pMem, int nBits )
{
    Mvc_Cover_t * p;
    int nBitsInUnsigned;

    nBitsInUnsigned  = 8 * sizeof(Mvc_CubeWord_t);
#ifdef USE_SYSTEM_MEMORY_MANAGEMENT
    p                = (Mvc_Cover_t *)ABC_ALLOC( char, sizeof(Mvc_Cover_t) );
#else
    p                = (Mvc_Cover_t *)Extra_MmFixedEntryFetch( pMem->pManC );
#endif
    p->pMem          = pMem;
    p->nBits         = nBits;
    p->nWords        = nBits / nBitsInUnsigned + (int)(nBits % nBitsInUnsigned > 0);
    p->nUnused       = p->nWords * nBitsInUnsigned - p->nBits;
    p->lCubes.nItems = 0;
    p->lCubes.pHead  = NULL;
    p->lCubes.pTail  = NULL;
    p->nCubesAlloc   = 0;
    p->pCubes        = NULL;
    p->pMask         = NULL;
    p->pLits         = NULL;
    return p;
}